

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzsparseblockdiagonal.cpp
# Opt level: O3

void __thiscall
TPZSparseBlockDiagonal<double>::TPZSparseBlockDiagonal
          (TPZSparseBlockDiagonal<double> *this,TPZVec<long> *blockgraph,
          TPZVec<long> *blockgraphindex,int64_t rows)

{
  long newsize;
  TPZVec<int> *this_00;
  long *plVar1;
  int *piVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  TPZBlockDiagonal<double>::TPZBlockDiagonal
            (&this->super_TPZBlockDiagonal<double>,&PTR_PTR_018582a0);
  (this->super_TPZBlockDiagonal<double>).super_TPZMatrix<double>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZSparseBlockDiagonal_01858020;
  TPZVec<long>::TPZVec(&this->fBlock,blockgraph);
  TPZVec<long>::TPZVec(&this->fBlockIndex,blockgraphindex);
  lVar5 = blockgraphindex->fNElements;
  newsize = lVar5 + -1;
  this_00 = &(this->super_TPZBlockDiagonal<double>).fBlockSize;
  TPZVec<int>::Resize(this_00,newsize);
  if (1 < lVar5) {
    plVar1 = blockgraphindex->fStore;
    piVar2 = (this->super_TPZBlockDiagonal<double>).fBlockSize.fStore;
    lVar5 = 0;
    lVar4 = *plVar1;
    do {
      lVar3 = plVar1[lVar5 + 1];
      piVar2[lVar5] = (int)lVar3 - (int)lVar4;
      lVar5 = lVar5 + 1;
      lVar4 = lVar3;
    } while (newsize != lVar5);
  }
  TPZBlockDiagonal<double>::Initialize(&this->super_TPZBlockDiagonal<double>,this_00);
  (this->super_TPZBlockDiagonal<double>).super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = rows;
  (this->super_TPZBlockDiagonal<double>).super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = rows;
  return;
}

Assistant:

TPZSparseBlockDiagonal<TVar>::TPZSparseBlockDiagonal(TPZVec<int64_t> &blockgraph, TPZVec<int64_t> &blockgraphindex,int64_t rows) : TPZRegisterClassId(&TPZSparseBlockDiagonal::ClassId), fBlock(blockgraph), fBlockIndex(blockgraphindex)
{
	int64_t numbl = blockgraphindex.NElements()-1;
	this->fBlockSize.Resize(numbl);
	int64_t ibl;
	for(ibl=0; ibl<numbl; ibl++)
	{
		this->fBlockSize[ibl] = blockgraphindex[ibl+1]-blockgraphindex[ibl];
	}
	this->Initialize(this->fBlockSize);
	this->fRow = rows;
	this->fCol = rows;
}